

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# throw_exception.hpp
# Opt level: O0

void boost::throw_exception<std::runtime_error>(runtime_error *e)

{
  undefined8 uVar1;
  exception *in_RDI;
  runtime_error *in_stack_00000038;
  
  throw_exception_assert_compatibility(in_RDI);
  uVar1 = __cxa_allocate_exception(0x40);
  exception_detail::enable_both<std::runtime_error>(in_stack_00000038);
  __cxa_throw(uVar1,&wrapexcept<std::runtime_error>::typeinfo,
              wrapexcept<std::runtime_error>::~wrapexcept);
}

Assistant:

BOOST_NORETURN inline void throw_exception( E const & e )
{
    //All boost exceptions are required to derive from std::exception,
    //to ensure compatibility with BOOST_NO_EXCEPTIONS.
    throw_exception_assert_compatibility(e);

#ifndef BOOST_EXCEPTION_DISABLE
    throw exception_detail::enable_both( e );
#else
    throw e;
#endif
}